

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void finish_pass1(j_decompress_ptr cinfo)

{
  jpeg_color_quantizer *pjVar1;
  my_cquantize_ptr_conflict cquantize;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->cquantize;
  cinfo->colormap = (JSAMPARRAY)pjVar1[1].start_pass;
  select_colors(cinfo,*(int *)&pjVar1[1].color_quantize);
  *(undefined4 *)&pjVar1[1].new_color_map = 1;
  return;
}

Assistant:

METHODDEF(void)
finish_pass1 (j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;

  /* Select the representative colors and fill in cinfo->colormap */
  cinfo->colormap = cquantize->sv_colormap;
  select_colors(cinfo, cquantize->desired);
  /* Force next pass to zero the color index table */
  cquantize->needs_zeroed = TRUE;
}